

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptAsyncFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,
          GeneratorVirtualScriptFunction *scriptFunction)

{
  byte bVar1;
  Recycler *pRVar2;
  JavascriptAsyncFunction *this_00;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_51;
  TrackAllocData local_50;
  DynamicType *local_28;
  DynamicType *type;
  GeneratorVirtualScriptFunction *scriptFunction_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  type = (DynamicType *)scriptFunction;
  scriptFunction_local = (GeneratorVirtualScriptFunction *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  bVar1 = (**(code **)((long)(scriptFunction->super_ScriptFunction).super_ScriptFunctionBase.
                             super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x3b8))();
  local_28 = CreateDeferredPrototypeAsyncFunctionType(this,entryPoint,(bool)(bVar1 & 1),false);
  pRVar2 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&JavascriptAsyncFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x19c1);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
  this_00 = (JavascriptAsyncFunction *)new<(Memory::ObjectInfoBits)1>(0x38,pRVar2,&local_51);
  JavascriptAsyncFunction::JavascriptAsyncFunction
            (this_00,local_28,(GeneratorVirtualScriptFunction *)type);
  return this_00;
}

Assistant:

JavascriptAsyncFunction* JavascriptLibrary::CreateAsyncFunction(JavascriptMethod entryPoint, GeneratorVirtualScriptFunction* scriptFunction)
    {
        DynamicType* type = CreateDeferredPrototypeAsyncFunctionType(entryPoint, scriptFunction->IsAnonymousFunction());

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptAsyncFunction, type, scriptFunction);
    }